

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

_Bool cf_socket_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  _Bool _Var2;
  uint uVar3;
  bool local_2d;
  int readable;
  cf_socket_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  _Var2 = Curl_bufq_is_empty((bufq *)((long)pvVar1 + 0xa0));
  if (_Var2) {
    uVar3 = Curl_socket_check(*(curl_socket_t *)((long)pvVar1 + 0x98),-1,-1,0);
    local_2d = 0 < (int)uVar3 && (uVar3 & 1) != 0;
    cf_local._7_1_ = local_2d;
  }
  else {
    cf_local._7_1_ = true;
  }
  return cf_local._7_1_;
}

Assistant:

static bool cf_socket_data_pending(struct Curl_cfilter *cf,
                                   const struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  int readable;

  (void)data;
  if(!Curl_bufq_is_empty(&ctx->recvbuf))
    return TRUE;

  readable = SOCKET_READABLE(ctx->sock, 0);
  return (readable > 0 && (readable & CURL_CSELECT_IN));
}